

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall CVmRun::compute_diff_sub(CVmRun *this,uchar *p)

{
  int iVar1;
  vm_val_t *val1;
  uchar *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t val;
  int in_stack_00000050;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  CVmRun *in_stack_ffffffffffffffc0;
  CVmRun *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  val1 = CVmStack::get(1);
  CVmStack::get(0);
  iVar1 = compute_diff(in_stack_ffffffffffffffd8,val1,in_RDI);
  if (iVar1 == 0) {
    pop_left_op(in_stack_ffffffffffffffc0,
                (vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_8 = op_overload(this,p._4_4_,(int)p,(vm_val_t *)val.val.native_desc,val._6_2_,val.typ,
                          in_stack_00000050);
  }
  else {
    CVmStack::discard();
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

const uchar *CVmRun::compute_diff_sub(VMG_ const uchar *p)
{
    if (compute_diff(vmg_ get(1), get(0)))
    {
        /* the difference is at TOS-1 - discard the second value */
        discard();
        return p;
    }
    else
    {
        /* try for an operator overload */
        vm_val_t val;
        pop_left_op(vmg_ &val);
        return op_overload(vmg_ p - entry_ptr_native_, -1,
                           &val, G_predef->operator_sub, 1,
                           VMERR_BAD_TYPE_SUB);
    }
}